

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  iterator iVar5;
  mapped_type *this_00;
  char *pcVar6;
  _Alloc_hider _Var7;
  allocator local_47d;
  allocator local_47c;
  allocator local_47b;
  allocator local_47a;
  allocator local_479;
  string helpString;
  CacheEntry e;
  string message;
  string entryKey;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string buffer;
  string cacheFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream fin;
  byte abStack_218 [488];
  
  std::__cxx11::string::string((string *)&cacheFile,(string *)path);
  std::__cxx11::string::append((char *)&cacheFile);
  if (internal) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&(this->Cache)._M_t);
  }
  _Var7._M_p = cacheFile._M_dataplus._M_p;
  bVar1 = cmsys::SystemTools::FileExists(cacheFile._M_dataplus._M_p);
  if (bVar1) {
    std::ifstream::ifstream(&fin,cacheFile._M_dataplus._M_p,_S_in);
    bVar1 = (abStack_218[*(long *)(_fin + -0x18)] & 5) == 0;
    if (bVar1) {
      buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
      buffer._M_string_length = 0;
      entryKey._M_dataplus._M_p = (pointer)&entryKey.field_2;
      entryKey._M_string_length = 0;
      buffer.field_2._M_local_buf[0] = '\0';
      entryKey.field_2._M_local_buf[0] = '\0';
      while ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
        helpString._M_dataplus._M_p = (pointer)&helpString.field_2;
        helpString._M_string_length = 0;
        helpString.field_2._M_local_buf[0] = '\0';
        CacheEntry::CacheEntry(&e);
        cmsys::SystemTools::GetLineFromStream((istream *)&fin,&buffer,(bool *)0x0,-1);
        for (_Var7 = buffer._M_dataplus; uVar4 = (ulong)(byte)*_Var7._M_p, uVar4 < 0x24;
            _Var7._M_p = _Var7._M_p + 1) {
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
            if ((0x800000001U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_003d8ce8;
            break;
          }
        }
        while (((char)uVar4 == '/' && (((byte *)_Var7._M_p)[1] == 0x2f))) {
          if ((((byte *)_Var7._M_p)[2] == 0x5c) && (((byte *)_Var7._M_p)[3] == 0x6e)) {
            std::__cxx11::string::append((char *)&helpString);
          }
          std::__cxx11::string::append((char *)&helpString);
          cmsys::SystemTools::GetLineFromStream((istream *)&fin,&buffer,(bool *)0x0,-1);
          uVar4 = (ulong)(byte)*buffer._M_dataplus._M_p;
          _Var7 = buffer._M_dataplus;
        }
        std::__cxx11::string::string((string *)&message,"HELPSTRING",(allocator *)&local_378);
        CacheEntry::SetProperty(&e,&message,helpString._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&message);
        std::__cxx11::string::string((string *)&message,_Var7._M_p,(allocator *)&local_378);
        bVar2 = ParseEntry(&message,&entryKey,&e.Value,&e.Type);
        std::__cxx11::string::~string((string *)&message);
        if (bVar2) {
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&excludes->_M_t,&entryKey);
          if ((_Rb_tree_header *)iVar5._M_node == &(excludes->_M_t)._M_impl.super__Rb_tree_header) {
            if ((!internal) && (e.Type == INTERNAL)) {
              iVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&includes->_M_t,&entryKey);
              if ((_Rb_tree_header *)iVar5._M_node ==
                  &(includes->_M_t)._M_impl.super__Rb_tree_header) goto LAB_003d8ce8;
            }
            if (!internal) {
              e.Type = INTERNAL;
              std::__cxx11::string::assign((char *)&helpString);
              std::__cxx11::string::append((string *)&helpString);
              std::__cxx11::string::append((char *)&helpString);
              std::__cxx11::string::append((string *)&helpString);
              std::__cxx11::string::append((char *)&helpString);
              std::__cxx11::string::string((string *)&message,"HELPSTRING",(allocator *)&local_378);
              CacheEntry::SetProperty(&e,&message,helpString._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&message);
            }
            bVar2 = ReadPropertyEntry(this,&entryKey,&e);
            if (!bVar2) {
              e.Initialized = true;
              this_00 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                        ::operator[](&this->Cache,&entryKey);
              CacheEntry::operator=(this_00,&e);
            }
          }
        }
        else {
          cmSystemTools::Error
                    ("Parse error in cache file ",cacheFile._M_dataplus._M_p,". Offending entry: ",
                     _Var7._M_p);
        }
LAB_003d8ce8:
        CacheEntry::~CacheEntry(&e);
        std::__cxx11::string::~string((string *)&helpString);
      }
      this->CacheMajorVersion = 0;
      this->CacheMinorVersion = 0;
      std::__cxx11::string::string
                ((string *)&e,"CMAKE_CACHE_MAJOR_VERSION",(allocator *)&helpString);
      pcVar6 = GetInitializedCacheValue(this,&e.Value);
      std::__cxx11::string::~string((string *)&e);
      if (pcVar6 == (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&e,"CMAKE_CACHE_MINOR_VERSION",(allocator *)&helpString);
        AddCacheEntry(this,&e.Value,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::string
                  ((string *)&e,"CMAKE_CACHE_MAJOR_VERSION",(allocator *)&helpString);
        AddCacheEntry(this,&e.Value,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&e);
      }
      else {
        helpString._M_dataplus._M_p = helpString._M_dataplus._M_p & 0xffffffff00000000;
        iVar3 = __isoc99_sscanf(pcVar6,"%u");
        if (iVar3 == 1) {
          this->CacheMajorVersion = (uint)helpString._M_dataplus._M_p;
        }
        std::__cxx11::string::string((string *)&e,"CMAKE_CACHE_MINOR_VERSION",(allocator *)&message)
        ;
        pcVar6 = GetInitializedCacheValue(this,&e.Value);
        std::__cxx11::string::~string((string *)&e);
        if (pcVar6 != (char *)0x0) {
          iVar3 = __isoc99_sscanf(pcVar6,"%u",&helpString);
          if (iVar3 == 1) {
            this->CacheMinorVersion = (uint)helpString._M_dataplus._M_p;
          }
        }
      }
      std::__cxx11::string::string((string *)&e,"CMAKE_CACHEFILE_DIR",(allocator *)&helpString);
      pcVar6 = GetInitializedCacheValue(this,&e.Value);
      std::__cxx11::string::~string((string *)&e);
      if (internal && pcVar6 != (char *)0x0) {
        std::__cxx11::string::string((string *)&e,(string *)path);
        std::__cxx11::string::string((string *)&helpString,pcVar6,(allocator *)&message);
        cmsys::SystemTools::ConvertToUnixSlashes(&e.Value);
        std::__cxx11::string::append((char *)&e);
        std::__cxx11::string::append((char *)&helpString);
        bVar2 = cmsys::SystemTools::SameFile(&helpString,&e.Value);
        if (!bVar2) {
          std::__cxx11::string::string
                    ((string *)&local_298,"The current CMakeCache.txt directory ",&local_479);
          std::operator+(&local_278,&local_298,&e.Value);
          std::__cxx11::string::string
                    ((string *)&local_2b8," is different than the directory ",&local_47a);
          std::operator+(&local_258,&local_278,&local_2b8);
          std::__cxx11::string::string((string *)&local_2f8,"CMAKE_CACHEFILE_DIR",&local_47b);
          pcVar6 = GetInitializedCacheValue(this,&local_2f8);
          std::__cxx11::string::string((string *)&local_2d8,pcVar6,&local_47c);
          std::operator+(&local_378,&local_258,&local_2d8);
          std::__cxx11::string::string
                    ((string *)&local_318,
                     " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                     ,&local_47d);
          std::operator+(&message,&local_378,&local_318);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_298);
          cmSystemTools::Error(message._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string((string *)&message);
        }
        std::__cxx11::string::~string((string *)&helpString);
        std::__cxx11::string::~string((string *)&e);
      }
      std::__cxx11::string::~string((string *)&entryKey);
      std::__cxx11::string::~string((string *)&buffer);
    }
    std::ifstream::~ifstream(&fin);
  }
  else {
    CleanCMakeFiles((cmCacheManager *)_Var7._M_p,path);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&cacheFile);
  return bVar1;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path,
                               bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  // clear the old cache, if we are reading in internal values
  if ( internal )
    {
    this->Cache.clear();
    }
  if(!cmSystemTools::FileExists(cacheFile.c_str()))
    {
    this->CleanCMakeFiles(path);
    return false;
    }

  cmsys::ifstream fin(cacheFile.c_str());
  if(!fin)
    {
    return false;
    }
  const char *realbuffer;
  std::string buffer;
  std::string entryKey;
  while(fin)
    {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    realbuffer = buffer.c_str();
    while(*realbuffer != '0' &&
          (*realbuffer == ' ' ||
           *realbuffer == '\t' ||
           *realbuffer == '\r' ||
           *realbuffer == '\n'))
      {
      realbuffer++;
      }
    // skip blank lines and comment lines
    if(realbuffer[0] == '#' || realbuffer[0] == 0)
      {
      continue;
      }
    while(realbuffer[0] == '/' && realbuffer[1] == '/')
      {
      if ((realbuffer[2] == '\\') && (realbuffer[3]=='n'))
        {
        helpString += "\n";
        helpString += &realbuffer[4];
        }
      else
        {
        helpString += &realbuffer[2];
        }
      cmSystemTools::GetLineFromStream(fin, buffer);
      realbuffer = buffer.c_str();
      if(!fin)
        {
        continue;
        }
      }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if(cmCacheManager::ParseEntry(realbuffer, entryKey, e.Value, e.Type))
      {
      if ( excludes.find(entryKey) == excludes.end() )
        {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if ( internal || (e.Type != cmState::INTERNAL) ||
             (includes.find(entryKey) != includes.end()) )
          {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal)
            {
            e.Type = cmState::INTERNAL;
            helpString = "DO NOT EDIT, ";
            helpString += entryKey;
            helpString += " loaded from external file.  "
              "To change this value edit this file: ";
            helpString += path;
            helpString += "/CMakeCache.txt"   ;
            e.SetProperty("HELPSTRING", helpString.c_str());
            }
          if(!this->ReadPropertyEntry(entryKey, e))
            {
            e.Initialized = true;
            this->Cache[entryKey] = e;
            }
          }
        }
      }
    else
      {
      cmSystemTools::Error("Parse error in cache file ", cacheFile.c_str(),
                           ". Offending entry: ", realbuffer);
      }
    }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if(const char* cmajor =
                  this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION"))
    {
    unsigned int v=0;
    if(sscanf(cmajor, "%u", &v) == 1)
      {
      this->CacheMajorVersion = v;
      }
    if(const char* cminor =
                  this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION"))
      {
      if(sscanf(cminor, "%u", &v) == 1)
        {
        this->CacheMinorVersion = v;
        }
      }
    }
  else
    {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache", cmState::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache", cmState::INTERNAL);

    }
  // check to make sure the cache directory has not
  // been moved
  const char* oldDir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir)
    {
    std::string currentcwd = path;
    std::string oldcwd = oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if(!cmSystemTools::SameFile(oldcwd, currentcwd))
      {
      std::string message =
        std::string("The current CMakeCache.txt directory ") +
        currentcwd + std::string(" is different than the directory ") +
        std::string(this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) +
        std::string(" where CMakeCache.txt was created. This may result "
                    "in binaries being created in the wrong place. If you "
                    "are not sure, reedit the CMakeCache.txt");
      cmSystemTools::Error(message.c_str());
      }
    }
  return true;
}